

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_optional_asn1_bool(CBS *cbs,int *out,CBS_ASN1_TAG tag,int default_value)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  int local_4c;
  undefined1 local_48 [3];
  uint8_t boolean;
  int present;
  CBS child2;
  CBS child;
  int default_value_local;
  CBS_ASN1_TAG tag_local;
  int *out_local;
  CBS *cbs_local;
  
  iVar1 = CBS_get_optional_asn1(cbs,(CBS *)&child2.len,&local_4c,tag);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (local_4c == 0) {
      *out = default_value;
    }
    else {
      iVar1 = CBS_get_asn1((CBS *)&child2.len,(CBS *)local_48,1);
      if (((iVar1 == 0) || (sVar2 = CBS_len((CBS *)local_48), sVar2 != 1)) ||
         (sVar2 = CBS_len((CBS *)&child2.len), sVar2 != 0)) {
        return 0;
      }
      puVar3 = CBS_data((CBS *)local_48);
      if (*puVar3 == '\0') {
        *out = 0;
      }
      else {
        if (*puVar3 != 0xff) {
          return 0;
        }
        *out = 1;
      }
    }
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_optional_asn1_bool(CBS *cbs, int *out, CBS_ASN1_TAG tag,
                               int default_value) {
  CBS child, child2;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    uint8_t boolean;

    if (!CBS_get_asn1(&child, &child2, CBS_ASN1_BOOLEAN) ||
        CBS_len(&child2) != 1 || CBS_len(&child) != 0) {
      return 0;
    }

    boolean = CBS_data(&child2)[0];
    if (boolean == 0) {
      *out = 0;
    } else if (boolean == 0xff) {
      *out = 1;
    } else {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}